

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

string * cmCTest::DecodeURL(string *__return_storage_ptr__,string *in)

{
  int iVar1;
  char *pcVar2;
  char buf [3];
  char local_2b;
  char local_2a;
  undefined1 local_29;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar2 = (in->_M_dataplus)._M_p;
  do {
    if (*pcVar2 == '%') {
      iVar1 = isxdigit((int)pcVar2[1]);
      if (iVar1 == 0) goto LAB_002839b4;
      iVar1 = isxdigit((int)pcVar2[2]);
      if (iVar1 == 0) goto LAB_002839b4;
      local_2b = pcVar2[1];
      local_2a = pcVar2[2];
      local_29 = 0;
      strtoul(&local_2b,(char **)0x0,0x10);
      std::__cxx11::string::_M_replace_aux
                ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,'\x01');
      pcVar2 = pcVar2 + 2;
    }
    else {
      if (*pcVar2 == '\0') {
        return __return_storage_ptr__;
      }
LAB_002839b4:
      std::__cxx11::string::_M_replace_aux
                ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,'\x01');
    }
    pcVar2 = pcVar2 + 1;
  } while( true );
}

Assistant:

std::string cmCTest::DecodeURL(const std::string& in)
{
  std::string out;
  for (const char* c = in.c_str(); *c; ++c) {
    if (*c == '%' && isxdigit(*(c + 1)) && isxdigit(*(c + 2))) {
      char buf[3] = { *(c + 1), *(c + 2), 0 };
      out.append(1, char(strtoul(buf, CM_NULLPTR, 16)));
      c += 2;
    } else {
      out.append(1, *c);
    }
  }
  return out;
}